

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall PrintVisitor::visit(PrintVisitor *this,BlockNode *node)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  PrintVisitor visitor;
  undefined **local_48;
  ostream *local_40;
  int local_38;
  undefined4 uStack_34;
  
  poVar2 = this->stream_;
  local_48 = (undefined **)&local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_48,(long)local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"BlockNode:\n",0xb);
  if (local_48 != (undefined **)&local_38) {
    operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
  }
  local_40 = this->stream_;
  local_38 = this->indentation_ + 1;
  local_48 = &PTR__Visitor_00156cf8;
  for (p_Var1 = (node->statements_).
                super__List_base<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&node->statements_; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))(p_Var1[1]._M_next,&local_48);
  }
  return;
}

Assistant:

void PrintVisitor::visit(const BlockNode& node)
{
  stream_ << indent() << "BlockNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& statement : node.getStatements())
  {
    statement->accept(visitor);
  }
}